

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O2

ExtensionRepository * duckdb::ExtensionRepository::GetCoreRepository(void)

{
  ExtensionRepository *in_RDI;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  ::std::__cxx11::string::string((string *)&local_28,"core",&local_49);
  ::std::__cxx11::string::string((string *)&local_48,"http://extensions.duckdb.org",&local_4a);
  ExtensionRepository(in_RDI,&local_28,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

ExtensionRepository ExtensionRepository::GetCoreRepository() {
	return {"core", CORE_REPOSITORY_URL};
}